

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

bool tinygltf::ParseTextureInfo
               (TextureInfo *texinfo,string *err,json *o,
               bool store_original_json_for_extras_and_extensions)

{
  undefined1 in_AL;
  bool bVar1;
  reference pbVar2;
  json *o_00;
  allocator local_6a;
  allocator local_69;
  json_const_iterator it;
  string local_48;
  
  if (texinfo != (TextureInfo *)0x0) {
    std::__cxx11::string::string((string *)&it,"index",&local_69);
    std::__cxx11::string::string((string *)&local_48,"TextureInfo",&local_6a);
    bVar1 = ParseIntegerProperty(&texinfo->index,err,o,(string *)&it,true,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    in_AL = std::__cxx11::string::~string((string *)&it);
    if (bVar1) {
      std::__cxx11::string::string((string *)&it,"texCoord",&local_69);
      std::__cxx11::string::string((string *)&local_48,"",&local_6a);
      ParseIntegerProperty(&texinfo->texCoord,err,o,(string *)&it,false,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&it);
      ParseExtensionsProperty(&texinfo->extensions,(string *)o,o_00);
      in_AL = ParseExtrasProperty(&texinfo->extras,o);
      if (store_original_json_for_extras_and_extensions) {
        it.m_object = (pointer)0x0;
        it.m_it.object_iterator._M_node = (_Base_ptr)0x0;
        it.m_it.array_iterator._M_current =
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)0x0;
        it.m_it.primitive_iterator.m_it = -0x8000000000000000;
        bVar1 = detail::FindMember(o,"extensions",&it);
        if (bVar1) {
          pbVar2 = nlohmann::detail::
                   iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*(&it);
          detail::JsonToString(&local_48,pbVar2,-1);
          std::__cxx11::string::operator=
                    ((string *)&texinfo->extensions_json_string,(string *)&local_48);
          std::__cxx11::string::~string((string *)&local_48);
        }
        it.m_object = (pointer)0x0;
        it.m_it.object_iterator._M_node = (_Base_ptr)0x0;
        it.m_it.array_iterator._M_current =
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)0x0;
        it.m_it.primitive_iterator.m_it = -0x8000000000000000;
        in_AL = detail::FindMember(o,"extras",&it);
        if ((bool)in_AL) {
          pbVar2 = nlohmann::detail::
                   iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*(&it);
          detail::JsonToString(&local_48,pbVar2,-1);
          std::__cxx11::string::operator=
                    ((string *)&texinfo->extras_json_string,(string *)&local_48);
          in_AL = std::__cxx11::string::~string((string *)&local_48);
        }
      }
    }
  }
  return (bool)in_AL;
}

Assistant:

static bool ParseTextureInfo(
    TextureInfo *texinfo, std::string *err, const detail::json &o,
    bool store_original_json_for_extras_and_extensions) {
  if (texinfo == nullptr) {
    return false;
  }

  if (!ParseIntegerProperty(&texinfo->index, err, o, "index",
                            /* required */ true, "TextureInfo")) {
    return false;
  }

  ParseIntegerProperty(&texinfo->texCoord, err, o, "texCoord", false);

  ParseExtrasAndExtensions(texinfo, err, o,
                           store_original_json_for_extras_and_extensions);

  return true;
}